

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O1

void dPrintPerf(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage,double rpg,double rcond,
               double *ferr,double *berr,char *equed,SuperLUStat_t *stat)

{
  double dVar1;
  double *pdVar2;
  flops_t *pfVar3;
  int *piVar4;
  int *piVar5;
  
  pdVar2 = stat->utime;
  pfVar3 = stat->ops;
  dVar1 = pdVar2[7];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    printf("Factor flops = %e\tMflops = %8.2f\n",(double)pfVar3[7],
           ((double)pfVar3[7] * 1e-06) / dVar1);
  }
  printf("Identify relaxed snodes\t= %8.2f\n",pdVar2[2]);
  dVar1 = pdVar2[0x11];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    printf("Solve flops = %.0f, Mflops = %8.2f\n",(double)pfVar3[0x11],
           ((double)pfVar3[0x11] * 1e-06) / dVar1);
  }
  piVar4 = (int *)L->Store;
  piVar5 = (int *)U->Store;
  printf("\tNo of nonzeros in factor L = %lld\n",(long)*piVar4);
  printf("\tNo of nonzeros in factor U = %lld\n",(long)*piVar5);
  printf("\tNo of nonzeros in L+U = %lld\n",(long)*piVar5 + (long)*piVar4);
  printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage->for_lu / 1000000.0,
         (double)mem_usage->total_needed / 1000000.0);
  printf("Number of memory expansions: %d\n",(ulong)(uint)stat->expansions);
  puts("\tFactor\tMflops\tSolve\tMflops\tEtree\tEquil\tRcond\tRefine");
  printf("PERF:%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f\n",pdVar2[7],
         ((double)pfVar3[7] * 1e-06) / pdVar2[7],pdVar2[0x11],
         ((double)pfVar3[0x11] * 1e-06) / pdVar2[0x11],pdVar2[3],pdVar2[4],pdVar2[0x10],pdVar2[0x12]
        );
  puts("\tRpg\t\tRcond\t\tFerr\t\tBerr\t\tEquil?");
  printf("NUM:\t%e\t%e\t%e\t%e\t%s\n",rpg,rcond,*ferr,*berr,equed);
  return;
}

Assistant:

void
dPrintPerf(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage,
           double rpg, double rcond, double *ferr,
           const double *berr, const char *equed, SuperLUStat_t *stat)
{
    SCformat *Lstore;
    NCformat *Ustore;
    double   *utime;
    flops_t  *ops;
    
    utime = stat->utime;
    ops   = stat->ops;
    
    if ( utime[FACT] != 0. )
	printf("Factor flops = %e\tMflops = %8.2f\n", ops[FACT],
	       ops[FACT]*1e-6/utime[FACT]);
    printf("Identify relaxed snodes	= %8.2f\n", utime[RELAX]);
    if ( utime[SOLVE] != 0. )
	printf("Solve flops = %.0f, Mflops = %8.2f\n", ops[SOLVE],
	       ops[SOLVE]*1e-6/utime[SOLVE]);
    
    Lstore = (SCformat *) L->Store;
    Ustore = (NCformat *) U->Store;
    printf("\tNo of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    printf("\tNo of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    printf("\tNo of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz);
	
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	   mem_usage->for_lu/1e6, mem_usage->total_needed/1e6);
    printf("Number of memory expansions: %d\n", stat->expansions);
	
    printf("\tFactor\tMflops\tSolve\tMflops\tEtree\tEquil\tRcond\tRefine\n");
    printf("PERF:%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f%8.2f\n",
	   utime[FACT], ops[FACT]*1e-6/utime[FACT],
	   utime[SOLVE], ops[SOLVE]*1e-6/utime[SOLVE],
	   utime[ETREE], utime[EQUIL], utime[RCOND], utime[REFINE]);
    
    printf("\tRpg\t\tRcond\t\tFerr\t\tBerr\t\tEquil?\n");
    printf("NUM:\t%e\t%e\t%e\t%e\t%s\n",
	   rpg, rcond, ferr[0], berr[0], equed);
    
}